

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_header.c
# Opt level: O0

int search_header(pcre2_code_8 *re,char *str)

{
  uint uVar1;
  undefined8 uVar2;
  size_t sVar3;
  pcre2_match_data_8 *match_data;
  int pcreExecRet;
  char *str_local;
  pcre2_code_8 *re_local;
  
  if (str == (char *)0x0) {
    re_local._4_4_ = 0;
  }
  else {
    uVar2 = pcre2_match_data_create_from_pattern_8(re,0);
    sVar3 = strlen(str);
    uVar1 = pcre2_match_8(re,str,sVar3,0,0,uVar2,0);
    pcre2_match_data_free_8(uVar2);
    if ((int)uVar1 < 0) {
      if (uVar1 == 0xffffffff) {
        re_local._4_4_ = 0;
      }
      else {
        fprintf(_stderr,"Problem with your regex (%d)\n",(ulong)uVar1);
      }
    }
    else {
      re_local._4_4_ = 1;
    }
  }
  return re_local._4_4_;
}

Assistant:

int search_header(pcre2_code *re, char *str) {
	int pcreExecRet;
	pcre2_match_data *match_data;

	if (str == NULL) {
		return 0;
	}
	match_data = pcre2_match_data_create_from_pattern(re, NULL); // init structure for result

	/* run the match */
	pcreExecRet = pcre2_match(re,
			str, 
			strlen(str),    // length of header string
			0,                      // Start looking at this point
			0,                      // pcre exec OPTIONS
			match_data, // pcre2_match_data
			NULL); // default match context

	pcre2_match_data_free(match_data);   /* Release memory used for the match */

	if (pcreExecRet < 0) {
		if (pcreExecRet == PCRE2_ERROR_NOMATCH)
			return 0;
		else
			fprintf(stderr, "Problem with your regex (%d)\n", pcreExecRet);
	} else
		return 1;
}